

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::exitPhase1ResetDuals(HEkkDual *this)

{
  double dVar1;
  HEkk *pHVar2;
  pointer pdVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  ulong uVar5;
  long lVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  HighsLogOptions *log_options_;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  
  pHVar2 = this->ekk_instance_;
  log_options_ = &(pHVar2->options_->super_HighsOptionsStruct).log_options;
  if ((pHVar2->info_).costs_perturbed == true) {
    highsLogDev(log_options_,kInfo,"Costs are already perturbed in exitPhase1ResetDuals\n");
  }
  else {
    highsLogDev(log_options_,kDetailed,"Re-perturbing costs when optimal in phase 1\n");
    HEkk::initialiseCost(this->ekk_instance_,kDual,2,true);
    HEkk::computeDual(this->ekk_instance_);
  }
  uVar9 = (pHVar2->lp_).num_row_ + (pHVar2->lp_).num_col_;
  uVar11 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar11;
  }
  dVar12 = 0.0;
  uVar8 = 0;
  for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
    if ((pHVar2->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11] != '\0') {
      lVar6 = (long)(pHVar2->lp_).num_col_;
      pvVar7 = &(pHVar2->lp_).row_upper_;
      pvVar4 = &(pHVar2->lp_).row_lower_;
      uVar5 = uVar11 - lVar6;
      if ((long)uVar11 < lVar6) {
        pvVar7 = &(pHVar2->lp_).col_upper_;
        pvVar4 = &(pHVar2->lp_).col_lower_;
        uVar5 = uVar11;
      }
      if (((pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar5] <= -INFINITY) &&
         (INFINITY <=
          (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar5])) {
        pdVar3 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar1 = pdVar3[uVar11];
        pdVar3[uVar11] = 0.0;
        pdVar3 = (pHVar2->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar3[uVar11] = pdVar3[uVar11] - dVar1;
        dVar12 = dVar12 + ABS(dVar1);
        highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kVerbose,
                    "Variable %d is free: shift cost to zero dual of %g\n",-dVar1,
                    uVar11 & 0xffffffff);
        uVar8 = (ulong)((int)uVar8 + 1);
      }
    }
  }
  if ((int)uVar8 != 0) {
    highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kDetailed,
                "Performed %d cost shift(s) for free variables to zero dual values: total = %g\n",
                dVar12,uVar8);
    (pHVar2->info_).costs_shifted = true;
  }
  return;
}

Assistant:

void HEkkDual::exitPhase1ResetDuals() {
  const HighsLp& lp = ekk_instance_.lp_;
  const SimplexBasis& basis = ekk_instance_.basis_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  // This use of costs_alt_perturbed is not executed by ctest
  //
  //  assert(99==2);
  if (info.costs_perturbed) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "Costs are already perturbed in exitPhase1ResetDuals\n");
  } else {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "Re-perturbing costs when optimal in phase 1\n");
    ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhase2, true);
    ekk_instance_.computeDual();
  }

  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  HighsInt num_shift = 0;
  double sum_shift = 0;
  for (HighsInt iVar = 0; iVar < numTot; iVar++) {
    if (basis.nonbasicFlag_[iVar]) {
      double lp_lower;
      double lp_upper;
      if (iVar < lp.num_col_) {
        lp_lower = lp.col_lower_[iVar];
        lp_upper = lp.col_upper_[iVar];
      } else {
        HighsInt iRow = iVar - lp.num_col_;
        lp_lower = lp.row_lower_[iRow];
        lp_upper = lp.row_upper_[iRow];
      }
      if (lp_lower <= -kHighsInf && lp_upper >= kHighsInf) {
        const double shift = -info.workDual_[iVar];
        info.workDual_[iVar] = 0;
        info.workCost_[iVar] = info.workCost_[iVar] + shift;
        num_shift++;
        sum_shift += fabs(shift);
        highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kVerbose,
                    "Variable %" HIGHSINT_FORMAT
                    " is free: shift cost to zero dual of %g\n",
                    iVar, shift);
      }
    }
  }
  if (num_shift) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kDetailed,
                "Performed %" HIGHSINT_FORMAT
                " cost shift(s) for free variables to zero "
                "dual values: total = %g\n",
                num_shift, sum_shift);
    info.costs_shifted = true;
  }
}